

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::copyTexImage1D
          (GLContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,int width,
          int border)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int iVar3;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"glCopyTexImage1D(",0x11);
    local_1c0.m_getName = glu::getTextureTargetName;
    local_1c0.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    local_1d0.m_getName = glu::getTextureFormatName;
    local_1d0.m_value = internalFormat;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,border);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  iVar2 = 0;
  iVar3 = 0;
  if (this->m_readFramebufferBinding == 0) {
    iVar2 = (this->m_baseViewport).m_data[1];
    iVar3 = (this->m_baseViewport).m_data[0];
  }
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x348))
            (target,level,internalFormat,iVar3 + x,iVar2 + y,width,border);
  return;
}

Assistant:

void GLContext::copyTexImage1D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int border)
{
	// Don't log offset.
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexImage1D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level << ", "
								  << glu::getTextureFormatStr(internalFormat) << ", "
								  << x << ", " << y << ", "
								  << width << ", " << border << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexImage1D(target, level, internalFormat, offset.x()+x, offset.y()+y, width, border);
}